

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall CDirectiveHeaderSize::writeTempData(CDirectiveHeaderSize *this,TempData *tempData)

{
  int64_t memoryAddress;
  long *in_R8;
  char *local_78;
  char *local_48;
  char *local_40;
  string local_38;
  TempData *local_18;
  TempData *tempData_local;
  CDirectiveHeaderSize *this_local;
  
  memoryAddress = this->virtualAddress;
  local_40 = "";
  if (this->headerSize < 0) {
    local_40 = "-";
  }
  if (this->headerSize < 0) {
    local_78 = (char *)-this->headerSize;
  }
  else {
    local_78 = (char *)this->headerSize;
  }
  local_48 = local_78;
  local_18 = tempData;
  tempData_local = (TempData *)this;
  tinyformat::format<char_const*,long>
            (&local_38,(tinyformat *)".headersize %s0x%08X",(char *)&local_40,&local_48,in_R8);
  TempData::writeLine(tempData,memoryAddress,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void CDirectiveHeaderSize::writeTempData(TempData& tempData) const
{
	tempData.writeLine(virtualAddress,tfm::format(".headersize %s0x%08X",
		headerSize < 0 ? "-" : "", headerSize < 0 ? -headerSize : headerSize));
}